

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::LoadFromRuleTSV
          (SentencePieceNormalizer *this,string_view filename)

{
  NormalizerSpec *this_00;
  __single_object model_proto;
  allocator<char> local_59;
  _Head_base<0UL,_sentencepiece::ModelProto_*,_false> local_58;
  __uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
  local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string local_38;
  
  local_48._M_len = (size_t)filename._M_str;
  std::make_unique<sentencepiece::ModelProto>();
  this_00 = ModelProto::_internal_mutable_normalizer_spec(local_58._M_head_impl);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,&local_48,&local_59);
  NormalizerSpec::set_normalization_rule_tsv(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  SentencePieceTrainer::PopulateNormalizerSpec((SentencePieceTrainer *)this,this_00,false);
  if (this->_vptr_SentencePieceNormalizer == (_func_int **)0x0) {
    sentencepiece::util::Status::~Status((Status *)this);
    local_50._M_t.
    super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
    .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
         (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
         (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
         local_58._M_head_impl;
    local_58._M_head_impl = (ModelProto *)0x0;
    (**(code **)(*(long *)filename._M_len + 0x10))(this,(long *)filename._M_len);
    std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
    ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                 *)&local_50);
  }
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
               *)&local_58);
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::LoadFromRuleTSV(
    absl::string_view filename) {
  auto model_proto = std::make_unique<ModelProto>();
  auto *spec = model_proto->mutable_normalizer_spec();
  spec->set_normalization_rule_tsv(std::string(filename));
  RETURN_IF_ERROR(SentencePieceTrainer::PopulateNormalizerSpec(spec));
  return Load(std::move(model_proto));
}